

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int naBaseCategory(atom *a)

{
  char *pcVar1;
  ResidueAndAtomPair *local_20;
  ResidueAndAtomPair *pair;
  atom *a_local;
  
  if (((a->props & 0x2000U) == 0) || ((a->props & 2U) == 0)) {
    a_local._4_4_ = 0x71;
  }
  else {
    pcVar1 = strstr(NAList,a->r->resname);
    if (pcVar1 == (char *)0x0) {
      a_local._4_4_ = 0x70;
    }
    else {
      for (local_20 = NAbaseGrouping; local_20->rlist != (char *)0x0; local_20 = local_20 + 1) {
        pcVar1 = strstr(local_20->rlist,a->r->resname);
        if (pcVar1 != (char *)0x0) {
          return local_20->bits;
        }
      }
      a_local._4_4_ = 0x70;
    }
  }
  return a_local._4_4_;
}

Assistant:

int naBaseCategory(atom *a) {
   ResidueAndAtomPair *pair;

   if ((a->props & DNA_PROP) && (a->props & SC_PROP)) {
      if(strstr(NAList, a->r->resname)) {
         for (pair = NAbaseGrouping; pair->rlist; pair++){
	    if(strstr(pair->rlist, a->r->resname)) {
	       return pair->bits; /* bits contain the atom type */
	    }
         }
         return baseOther; /* not in table */
      }
     else return baseOther; /* not in list */
   }
   else return nonBase; /* backbone or not recognized as a nucleic acid */
}